

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports-runtime.cpp
# Opt level: O1

void __thiscall rtosc::helpers::Capture::map_blobs(Capture *this)

{
  rtosc_arg_val_t *prVar1;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  *this_00;
  long lVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (0 < this->nargs) {
    lVar6 = 0;
    do {
      prVar1 = this->arg_vals;
      if (((prVar1[lVar6].type == 'b') && (prVar1[lVar6].val.b.data != (uint8_t *)0x0)) &&
         (prVar1[lVar6].val.i != 0)) {
        this_00 = this->scratch_bufs;
        std::
        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::resize(this_00,(*(long *)(this_00 + 8) - *(long *)this_00 >> 3) * -0x5555555555555555 + 1)
        ;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)
                   (*(long *)(this->scratch_bufs + 8) + -0x18),(long)this->arg_vals[lVar6].val.i);
        lVar4 = (long)this->arg_vals[lVar6].val.i;
        if (0 < lVar4) {
          lVar2 = *(long *)(*(long *)(this->scratch_bufs + 8) + -0x18);
          puVar3 = this->arg_vals[lVar6].val.b.data;
          lVar4 = lVar4 + 1;
          lVar5 = 0;
          do {
            *(uint8_t *)(lVar2 + lVar5) = puVar3[lVar5];
            lVar4 = lVar4 + -1;
            lVar5 = lVar5 + 1;
          } while (1 < lVar4);
        }
        this->arg_vals[lVar6].val.b.data = *(uint8_t **)(*(long *)(this->scratch_bufs + 8) + -0x18);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < this->nargs);
  }
  return;
}

Assistant:

void map_blobs()
    {
        for(int i = 0; i < nargs; ++i)
        {
            if(arg_vals[i].type == 'b'
               && arg_vals[i].val.b.data && arg_vals[i].val.b.len)
            {
                scratch_bufs->resize(scratch_bufs->size()+1);
                scratch_bufs->back().resize(arg_vals[i].val.b.len);
                std::copy_n(arg_vals[i].val.b.data,
                            arg_vals[i].val.b.len,
                            scratch_bufs->back().begin());
                arg_vals[i].val.b.data = (uint8_t*)scratch_bufs->back().data();
            }
        }
    }